

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O0

void __thiscall
duckdb::WriteAheadLogSerializer::WriteAheadLogSerializer
          (WriteAheadLogSerializer *this,WriteAheadLog *wal,WALType wal_type)

{
  bool bVar1;
  WriteAheadLog *in_RSI;
  Serializer *in_RDI;
  WriteAheadLog *in_stack_00000058;
  WriteAheadLog *in_stack_00000510;
  _Elt_pointer *value;
  Serializer *pSVar2;
  field_id_t field_id;
  Serializer *this_00;
  WriteAheadLog *in_stack_ffffffffffffff98;
  ChecksumWriter *in_stack_ffffffffffffffa0;
  WriteStream *in_stack_ffffffffffffffa8;
  BinarySerializer *in_stack_ffffffffffffffb0;
  AttachedDatabase *in_stack_ffffffffffffffc8;
  SerializationOptions *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  ChecksumWriter::ChecksumWriter(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  SerializationOptions::SerializationOptions((SerializationOptions *)0xc757fc);
  value = (_Elt_pointer *)
          ((long)&(in_RDI->data).contexts.c.
                  super__Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish + 0x10);
  pSVar2 = in_RDI;
  WriteAheadLog::GetDatabase(in_RSI);
  field_id = (field_id_t)((ulong)pSVar2 >> 0x30);
  SerializationOptions::SerializationOptions(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  BinarySerializer::BinarySerializer
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (SerializationOptions *)in_stack_ffffffffffffffa0);
  SerializationOptions::~SerializationOptions((SerializationOptions *)0xc7584b);
  bVar1 = WriteAheadLog::Initialized((WriteAheadLog *)0xc75855);
  if (!bVar1) {
    WriteAheadLog::Initialize(in_stack_00000058);
  }
  WriteAheadLog::WriteVersion(in_stack_00000510);
  BinarySerializer::Begin((BinarySerializer *)0xc758d7);
  Serializer::WriteProperty<duckdb::WALType>(this_00,field_id,(char *)in_RDI,(WALType *)value);
  return;
}

Assistant:

WriteAheadLogSerializer(WriteAheadLog &wal, WALType wal_type)
	    : checksum_writer(wal), serializer(checksum_writer, SerializationOptions(wal.GetDatabase())) {
		if (!wal.Initialized()) {
			wal.Initialize();
		}
		// write a version marker if none has been written yet
		wal.WriteVersion();
		serializer.Begin();
		serializer.WriteProperty(100, "wal_type", wal_type);
	}